

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsNodeQueue.cpp
# Opt level: O3

void __thiscall HighsNodeQueue::unlink_suboptimal(HighsNodeQueue *this,int64_t node)

{
  SuboptimalNodeRbTree rbTree;
  CacheMinRbTree<HighsNodeQueue::SuboptimalNodeRbTree> local_20;
  HighsNodeQueue *local_10;
  
  local_20.super_RbTree<HighsNodeQueue::SuboptimalNodeRbTree>.rootNode = &this->suboptimalRoot;
  local_20.first_ = &this->suboptimalMin;
  local_10 = this;
  ::highs::CacheMinRbTree<HighsNodeQueue::SuboptimalNodeRbTree>::unlink(&local_20,(char *)node);
  this->numSuboptimal = this->numSuboptimal + -1;
  return;
}

Assistant:

void HighsNodeQueue::unlink_suboptimal(int64_t node) {
  assert(node != -1);
  SuboptimalNodeRbTree rbTree(this);
  rbTree.unlink(node);
  --numSuboptimal;
}